

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameEditSql(sqlite3_context *pCtx,RenameCtx *pRename,char *zSql,char *zNew,int bQuote)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  size_t __n;
  sqlite3 *db_00;
  RenameToken *p;
  RenameToken *pBest;
  char *zReplace;
  u32 nReplace;
  int iOff;
  int nOut;
  char *zBuf2;
  char *zBuf1;
  i64 nQuot;
  char *zOut;
  char *zQuot;
  int rc;
  sqlite3 *db;
  i64 nSql;
  i64 nNew;
  int bQuote_local;
  char *zNew_local;
  char *zSql_local;
  RenameCtx *pRename_local;
  sqlite3_context *pCtx_local;
  
  uVar2 = sqlite3Strlen30(zNew);
  nReplace = sqlite3Strlen30(zSql);
  __n = (size_t)(int)nReplace;
  db_00 = sqlite3_context_db_handle(pCtx);
  zQuot._4_4_ = 0;
  zOut = (char *)0x0;
  zBuf1._0_4_ = 0;
  zBuf2 = (char *)0x0;
  _iOff = (RenameToken *)0x0;
  if (zNew == (char *)0x0) {
    nQuot = (i64)sqlite3DbMallocZero(db_00,(__n * 2 + 1) * 3);
    if ((void *)nQuot != (void *)0x0) {
      zBuf2 = (char *)(nQuot + __n * 2 + 1);
      _iOff = (RenameToken *)(nQuot + __n * 4 + 2);
    }
  }
  else {
    zOut = sqlite3MPrintf(db_00,"\"%w\" ",zNew);
    if (zOut == (char *)0x0) {
      return 7;
    }
    iVar3 = sqlite3Strlen30(zOut);
    zBuf1._0_4_ = iVar3 - 1;
    nQuot = (i64)sqlite3DbMallocZero(db_00,__n + (long)pRename->nList * (long)(int)(uint)zBuf1 + 1);
  }
  if (nQuot == 0) {
    zQuot._4_4_ = 7;
  }
  else {
    memcpy((void *)nQuot,zSql,__n);
    while (pRename->pList != (RenameToken *)0x0) {
      p = renameColumnTokenNext(pRename);
      if (zNew == (char *)0x0) {
        memcpy(zBuf2,(p->t).z,(ulong)(p->t).n);
        zBuf2[(p->t).n] = '\0';
        sqlite3Dequote(zBuf2);
        pcVar1 = "\")\n";
        if ((p->t).z[(p->t).n] == '\'') {
          pcVar1 = ",\n  ";
        }
        sqlite3_snprintf((int)(__n << 1),(char *)_iOff,"%Q%s",zBuf2,pcVar1 + 3);
        pBest = _iOff;
        zReplace._4_4_ = sqlite3Strlen30((char *)_iOff);
      }
      else if ((bQuote != 0) ||
              (iVar3 = sqlite3IsIdChar(*(p->t).z), pBest = (RenameToken *)zNew,
              zReplace._4_4_ = uVar2, iVar3 == 0)) {
        pBest = (RenameToken *)zOut;
        zReplace._4_4_ = (uint)zBuf1;
        if ((p->t).z[(p->t).n] == '\"') {
          zReplace._4_4_ = (uint)zBuf1 + 1;
        }
      }
      iVar3 = (int)(p->t).z - (int)zSql;
      if ((p->t).n != zReplace._4_4_) {
        memmove((void *)(nQuot + (ulong)(iVar3 + zReplace._4_4_)),
                (void *)(nQuot + (ulong)(iVar3 + (p->t).n)),(ulong)(nReplace - (iVar3 + (p->t).n)));
        nReplace = (zReplace._4_4_ - (p->t).n) + nReplace;
        *(undefined1 *)(nQuot + (int)nReplace) = 0;
      }
      memcpy((void *)(nQuot + iVar3),pBest,(ulong)zReplace._4_4_);
      sqlite3DbFree(db_00,p);
    }
    sqlite3_result_text(pCtx,(char *)nQuot,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3DbFree(db_00,(void *)nQuot);
  }
  sqlite3_free(zOut);
  return zQuot._4_4_;
}

Assistant:

static int renameEditSql(
  sqlite3_context *pCtx,          /* Return result here */
  RenameCtx *pRename,             /* Rename context */
  const char *zSql,               /* SQL statement to edit */
  const char *zNew,               /* New token text */
  int bQuote                      /* True to always quote token */
){
  i64 nNew = sqlite3Strlen30(zNew);
  i64 nSql = sqlite3Strlen30(zSql);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  int rc = SQLITE_OK;
  char *zQuot = 0;
  char *zOut;
  i64 nQuot = 0;
  char *zBuf1 = 0;
  char *zBuf2 = 0;

  if( zNew ){
    /* Set zQuot to point to a buffer containing a quoted copy of the
    ** identifier zNew. If the corresponding identifier in the original
    ** ALTER TABLE statement was quoted (bQuote==1), then set zNew to
    ** point to zQuot so that all substitutions are made using the
    ** quoted version of the new column name.  */
    zQuot = sqlite3MPrintf(db, "\"%w\" ", zNew);
    if( zQuot==0 ){
      return SQLITE_NOMEM;
    }else{
      nQuot = sqlite3Strlen30(zQuot)-1;
    }

    assert( nQuot>=nNew );
    zOut = sqlite3DbMallocZero(db, nSql + pRename->nList*nQuot + 1);
  }else{
    zOut = (char*)sqlite3DbMallocZero(db, (nSql*2+1) * 3);
    if( zOut ){
      zBuf1 = &zOut[nSql*2+1];
      zBuf2 = &zOut[nSql*4+2];
    }
  }

  /* At this point pRename->pList contains a list of RenameToken objects
  ** corresponding to all tokens in the input SQL that must be replaced
  ** with the new column name, or with single-quoted versions of themselves.
  ** All that remains is to construct and return the edited SQL string. */
  if( zOut ){
    int nOut = nSql;
    memcpy(zOut, zSql, nSql);
    while( pRename->pList ){
      int iOff;                   /* Offset of token to replace in zOut */
      u32 nReplace;
      const char *zReplace;
      RenameToken *pBest = renameColumnTokenNext(pRename);

      if( zNew ){
        if( bQuote==0 && sqlite3IsIdChar(*pBest->t.z) ){
          nReplace = nNew;
          zReplace = zNew;
        }else{
          nReplace = nQuot;
          zReplace = zQuot;
          if( pBest->t.z[pBest->t.n]=='"' ) nReplace++;
        }
      }else{
        /* Dequote the double-quoted token. Then requote it again, this time
        ** using single quotes. If the character immediately following the
        ** original token within the input SQL was a single quote ('), then
        ** add another space after the new, single-quoted version of the
        ** token. This is so that (SELECT "string"'alias') maps to
        ** (SELECT 'string' 'alias'), and not (SELECT 'string''alias').  */
        memcpy(zBuf1, pBest->t.z, pBest->t.n);
        zBuf1[pBest->t.n] = 0;
        sqlite3Dequote(zBuf1);
        sqlite3_snprintf(nSql*2, zBuf2, "%Q%s", zBuf1,
            pBest->t.z[pBest->t.n]=='\'' ? " " : ""
        );
        zReplace = zBuf2;
        nReplace = sqlite3Strlen30(zReplace);
      }

      iOff = pBest->t.z - zSql;
      if( pBest->t.n!=nReplace ){
        memmove(&zOut[iOff + nReplace], &zOut[iOff + pBest->t.n],
            nOut - (iOff + pBest->t.n)
        );
        nOut += nReplace - pBest->t.n;
        zOut[nOut] = '\0';
      }
      memcpy(&zOut[iOff], zReplace, nReplace);
      sqlite3DbFree(db, pBest);
    }

    sqlite3_result_text(pCtx, zOut, -1, SQLITE_TRANSIENT);
    sqlite3DbFree(db, zOut);
  }else{
    rc = SQLITE_NOMEM;
  }

  sqlite3_free(zQuot);
  return rc;
}